

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Vta_Obj_t * Vga_ManFindOrAdd(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  Vta_Obj_t *local_40;
  int *pPlace;
  Vta_Obj_t *pVStack_28;
  int i;
  Vta_Obj_t *pThis;
  int iFrame_local;
  int iObj_local;
  Vta_Man_t *p_local;
  
  if ((-1 < iObj) && (-2 < iFrame)) {
    if (p->nObjs == p->nObjsAlloc) {
      if (p->pObjs == (Vta_Obj_t *)0x0) {
        local_40 = (Vta_Obj_t *)malloc((long)(p->nObjsAlloc << 1) << 4);
      }
      else {
        local_40 = (Vta_Obj_t *)realloc(p->pObjs,(long)(p->nObjsAlloc << 1) << 4);
      }
      p->pObjs = local_40;
      memset(p->pObjs + p->nObjsAlloc,0,(long)p->nObjsAlloc << 4);
      p->nObjsAlloc = p->nObjsAlloc << 1;
      if (p->pBins != (int *)0x0) {
        free(p->pBins);
        p->pBins = (int *)0x0;
      }
      iVar1 = Abc_PrimeCudd(p->nBins << 1);
      p->nBins = iVar1;
      piVar2 = (int *)calloc((long)p->nBins,4);
      p->pBins = piVar2;
      pPlace._4_4_ = 1;
      while( true ) {
        bVar3 = false;
        if (pPlace._4_4_ < p->nObjs) {
          pVStack_28 = Vta_ManObj(p,pPlace._4_4_);
          bVar3 = pVStack_28 != (Vta_Obj_t *)0x0;
        }
        if (!bVar3) break;
        pVStack_28->iNext = 0;
        piVar2 = Vga_ManLookup(p,pVStack_28->iObj,pVStack_28->iFrame);
        if (*piVar2 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                        ,0x134,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
        }
        *piVar2 = pPlace._4_4_;
        pPlace._4_4_ = pPlace._4_4_ + 1;
      }
    }
    piVar2 = Vga_ManLookup(p,iObj,iFrame);
    if (*piVar2 == 0) {
      iVar1 = p->nObjs;
      p->nObjs = iVar1 + 1;
      *piVar2 = iVar1;
      p_local = (Vta_Man_t *)Vta_ManObj(p,*piVar2);
      *(int *)&p_local->pGia = iObj;
      *(int *)((long)&p_local->pGia + 4) = iFrame;
    }
    else {
      p_local = (Vta_Man_t *)Vta_ManObj(p,*piVar2);
    }
    return (Vta_Obj_t *)p_local;
  }
  __assert_fail("iObj >= 0 && iFrame >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                ,0x125,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
}

Assistant:

static inline Vta_Obj_t * Vga_ManFindOrAdd( Vta_Man_t * p, int iObj, int iFrame )
{
    Vta_Obj_t * pThis;
    int i, * pPlace;
    assert( iObj >= 0 && iFrame >= -1 );
    if ( p->nObjs == p->nObjsAlloc )
    {
        // resize objects
        p->pObjs = ABC_REALLOC( Vta_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, p->nObjsAlloc * sizeof(Vta_Obj_t) );
        p->nObjsAlloc *= 2;
        // rehash entries in the table
        ABC_FREE( p->pBins );
        p->nBins = Abc_PrimeCudd( 2 * p->nBins );
        p->pBins = ABC_CALLOC( int, p->nBins );
        Vta_ManForEachObj( p, pThis, i )
        {
            pThis->iNext = 0;
            pPlace = Vga_ManLookup( p, pThis->iObj, pThis->iFrame );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Vga_ManLookup( p, iObj, iFrame );
    if ( *pPlace )
        return Vta_ManObj(p, *pPlace);
    *pPlace = p->nObjs++;
    pThis = Vta_ManObj(p, *pPlace);
    pThis->iObj   = iObj;
    pThis->iFrame = iFrame;
    return pThis;
}